

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O3

bool __thiscall
cmNinjaTargetGenerator::SetMsvcTargetPdbVariable
          (cmNinjaTargetGenerator *this,cmNinjaVars *vars,string *config)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  cmMakefile *this_00;
  cmLocalNinjaGenerator *pcVar3;
  _Alloc_hider _Var4;
  TargetType TVar5;
  cmValue cVar6;
  cmGlobalNinjaGenerator *pcVar7;
  string *psVar8;
  mapped_type *pmVar9;
  bool bVar10;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string_view source;
  string_view source_00;
  string pdbPath;
  string compilePdbPath;
  string local_138;
  string local_118;
  string local_e8;
  size_type local_c8;
  pointer local_c0;
  cmNinjaVars *local_b8;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  this_00 = (this->super_cmCommonTargetGenerator).Makefile;
  paVar1 = &local_e8.field_2;
  local_e8._M_dataplus._M_p = (pointer)paVar1;
  local_b8 = vars;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"MSVC_C_ARCHITECTURE_ID","");
  cVar6 = cmMakefile::GetDefinition(this_00,&local_e8);
  bVar10 = true;
  if (cVar6.Value == (string *)0x0) {
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_118,"MSVC_CXX_ARCHITECTURE_ID","");
    cVar6 = cmMakefile::GetDefinition(this_00,&local_118);
    bVar10 = true;
    if (cVar6.Value == (string *)0x0) {
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_138,"MSVC_CUDA_ARCHITECTURE_ID","");
      cVar6 = cmMakefile::GetDefinition(this_00,&local_138);
      bVar10 = cVar6.Value != (string *)0x0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p,
                        CONCAT71(local_138.field_2._M_allocated_capacity._1_7_,
                                 local_138.field_2._M_local_buf[0]) + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,
                      CONCAT71(local_118.field_2._M_allocated_capacity._1_7_,
                               local_118.field_2._M_local_buf[0]) + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_e8._M_dataplus._M_p,(ulong)(local_e8.field_2._M_allocated_capacity + 1));
  }
  if (bVar10 != false) {
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    local_138._M_string_length = 0;
    local_138.field_2._M_local_buf[0] = '\0';
    cmCommonTargetGenerator::ComputeTargetCompilePDB
              (&local_70,&this->super_cmCommonTargetGenerator,config);
    TVar5 = cmGeneratorTarget::GetType((this->super_cmCommonTargetGenerator).GeneratorTarget);
    if ((((TVar5 == EXECUTABLE) ||
         (TVar5 = cmGeneratorTarget::GetType((this->super_cmCommonTargetGenerator).GeneratorTarget),
         TVar5 == STATIC_LIBRARY)) ||
        (TVar5 = cmGeneratorTarget::GetType((this->super_cmCommonTargetGenerator).GeneratorTarget),
        TVar5 == SHARED_LIBRARY)) ||
       (TVar5 = cmGeneratorTarget::GetType((this->super_cmCommonTargetGenerator).GeneratorTarget),
       TVar5 == MODULE_LIBRARY)) {
      cmGeneratorTarget::GetPDBDirectory
                (&local_90,(this->super_cmCommonTargetGenerator).GeneratorTarget,config);
      _Var4._M_p = local_90._M_dataplus._M_p;
      local_118._M_string_length = (size_type)&local_118.field_2;
      local_118._M_dataplus._M_p = (pointer)0x1;
      local_118.field_2._M_local_buf[0] = '/';
      cmGeneratorTarget::GetPDBName
                (&local_b0,(this->super_cmCommonTargetGenerator).GeneratorTarget,config);
      local_e8._M_dataplus._M_p = (pointer)local_90._M_string_length;
      local_e8._M_string_length = (size_type)_Var4._M_p;
      local_e8.field_2._M_allocated_capacity = (size_type)local_118._M_dataplus._M_p;
      local_e8.field_2._8_8_ = local_118._M_string_length;
      local_c8 = local_b0._M_string_length;
      local_c0 = local_b0._M_dataplus._M_p;
      views._M_len = 3;
      views._M_array = (iterator)&local_e8;
      cmCatViews_abi_cxx11_(&local_50,views);
      std::__cxx11::string::operator=((string *)&local_138,(string *)&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
    }
    pcVar3 = this->LocalGenerator;
    pcVar7 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(pcVar3);
    psVar8 = cmGlobalNinjaGenerator::ConvertToNinjaPath(pcVar7,&local_138);
    source._M_str = (psVar8->_M_dataplus)._M_p;
    source._M_len = psVar8->_M_string_length;
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
              (&local_e8,
               &(pcVar3->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,source,SHELL);
    paVar2 = &local_118.field_2;
    local_118._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"TARGET_PDB","");
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_b8,&local_118);
    std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != paVar2) {
      operator_delete(local_118._M_dataplus._M_p,
                      CONCAT71(local_118.field_2._M_allocated_capacity._1_7_,
                               local_118.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != paVar1) {
      operator_delete(local_e8._M_dataplus._M_p,(ulong)(local_e8.field_2._M_allocated_capacity + 1))
      ;
    }
    pcVar3 = this->LocalGenerator;
    pcVar7 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(pcVar3);
    psVar8 = cmGlobalNinjaGenerator::ConvertToNinjaPath(pcVar7,&local_70);
    source_00._M_str = (psVar8->_M_dataplus)._M_p;
    source_00._M_len = psVar8->_M_string_length;
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
              (&local_e8,
               &(pcVar3->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,source_00,SHELL);
    local_118._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"TARGET_COMPILE_PDB","");
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_b8,&local_118);
    std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != paVar2) {
      operator_delete(local_118._M_dataplus._M_p,
                      CONCAT71(local_118.field_2._M_allocated_capacity._1_7_,
                               local_118.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != paVar1) {
      operator_delete(local_e8._M_dataplus._M_p,(ulong)(local_e8.field_2._M_allocated_capacity + 1))
      ;
    }
    EnsureParentDirectoryExists(this,&local_138);
    EnsureParentDirectoryExists(this,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p,
                      CONCAT71(local_138.field_2._M_allocated_capacity._1_7_,
                               local_138.field_2._M_local_buf[0]) + 1);
    }
    return bVar10;
  }
  return false;
}

Assistant:

bool cmNinjaTargetGenerator::SetMsvcTargetPdbVariable(
  cmNinjaVars& vars, const std::string& config) const
{
  cmMakefile* mf = this->GetMakefile();
  if (mf->GetDefinition("MSVC_C_ARCHITECTURE_ID") ||
      mf->GetDefinition("MSVC_CXX_ARCHITECTURE_ID") ||
      mf->GetDefinition("MSVC_CUDA_ARCHITECTURE_ID")) {
    std::string pdbPath;
    std::string compilePdbPath = this->ComputeTargetCompilePDB(config);
    if (this->GeneratorTarget->GetType() == cmStateEnums::EXECUTABLE ||
        this->GeneratorTarget->GetType() == cmStateEnums::STATIC_LIBRARY ||
        this->GeneratorTarget->GetType() == cmStateEnums::SHARED_LIBRARY ||
        this->GeneratorTarget->GetType() == cmStateEnums::MODULE_LIBRARY) {
      pdbPath = cmStrCat(this->GeneratorTarget->GetPDBDirectory(config), '/',
                         this->GeneratorTarget->GetPDBName(config));
    }

    vars["TARGET_PDB"] = this->GetLocalGenerator()->ConvertToOutputFormat(
      this->ConvertToNinjaPath(pdbPath), cmOutputConverter::SHELL);
    vars["TARGET_COMPILE_PDB"] =
      this->GetLocalGenerator()->ConvertToOutputFormat(
        this->ConvertToNinjaPath(compilePdbPath), cmOutputConverter::SHELL);

    this->EnsureParentDirectoryExists(pdbPath);
    this->EnsureParentDirectoryExists(compilePdbPath);
    return true;
  }
  return false;
}